

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O0

void __thiscall async_simple::Executor::~Executor(Executor *this)

{
  code *pcVar1;
  Executor *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Executor() {}